

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall inject::circular_dependency::~circular_dependency(circular_dependency *this)

{
  ~circular_dependency(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~circular_dependency() throw() { }